

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::root_name(StringRef path,Style style)

{
  StringRef *this;
  char cVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  Style in_R8D;
  bool bVar5;
  bool bVar6;
  StringRef path_00;
  StringRef SVar7;
  const_iterator b;
  
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)path.Length;
  path_00.Length._4_4_ = 0;
  begin(&b,(path *)path.Data,path_00,in_R8D);
  if ((path *)b.Path.Data == (path *)path.Data) {
    pcVar3 = (char *)0x0;
    sVar4 = 0;
    if (b.Position == path.Length) goto LAB_00176319;
  }
  if (b.Component.Length < 3) {
LAB_001762e0:
    bVar5 = false;
  }
  else {
    this = &b.Component;
    cVar1 = StringRef::operator[](this,0);
    if ((cVar1 != '/') && (cVar1 != '\\' || style != windows)) goto LAB_001762e0;
    cVar1 = StringRef::operator[](this,1);
    cVar2 = StringRef::operator[](this,0);
    bVar5 = cVar1 == cVar2;
  }
  if ((style == windows) && (b.Component.Length != 0)) {
    bVar6 = b.Component.Data[b.Component.Length - 1] == ':';
  }
  else {
    bVar6 = false;
  }
  pcVar3 = (char *)0x0;
  sVar4 = 0;
  if ((bool)(bVar5 | bVar6)) {
    pcVar3 = b.Component.Data;
    sVar4 = b.Component.Length;
  }
LAB_00176319:
  SVar7.Length = sVar4;
  SVar7.Data = pcVar3;
  return SVar7;
}

Assistant:

StringRef root_name(StringRef path, Style style) {
  const_iterator b = begin(path, style), e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      // just {C:,//net}, return the first component.
      return *b;
    }
  }

  // No path or no name.
  return StringRef();
}